

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O2

uint32_t bf_get_uint32_be(bfile_t *bfile)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  
  bVar1 = bf_get_uint8(bfile);
  bVar2 = bf_get_uint8(bfile);
  bVar3 = bf_get_uint8(bfile);
  bVar4 = bf_get_uint8(bfile);
  return (uint)bVar4 | (uint)bVar3 << 8 | (uint)bVar2 << 0x10 | (uint)bVar1 << 0x18;
}

Assistant:

uint32_t
bf_get_uint32_be(
    bfile_t * bfile )
{
    uint32_t val;
    val = bf_get_uint8( bfile ) << 24;
    val |= bf_get_uint8( bfile ) << 16;
    val |= bf_get_uint8( bfile ) << 8;
    val |= bf_get_uint8( bfile );
    return val;
}